

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

int __thiscall CVmTimeZone::init(CVmTimeZone *this,EVP_PKEY_CTX *ctx)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char *__dest;
  vmtz_rule *pvVar4;
  vmtz_ttype *pvVar5;
  vmtz_ttype *pvVar6;
  char *dst_abbr;
  char *std_abbr;
  size_t dst_abbr_len;
  size_t std_abbr_len;
  undefined8 in_stack_ffffffffffffff88;
  vmtz_ttype *pvVar7;
  char *in_stack_ffffffffffffff90;
  os_tzrule_t *in_stack_ffffffffffffff98;
  vmtz_rule *in_stack_ffffffffffffffa0;
  vmtz_ttype *local_50;
  
  this->trans_ = (vmtz_trans *)0x0;
  this->trans_cnt_ = 0;
  this->rule_ = (vmtz_rule *)0x0;
  this->rule_cnt_ = 0;
  sVar1 = strlen((char *)(ctx + 8));
  sVar2 = strlen((char *)(ctx + 0x18));
  pcVar3 = (char *)operator_new__(sVar1 + sVar2 + 2);
  this->abbr_ = pcVar3;
  pcVar3 = this->abbr_;
  strcpy(pcVar3,(char *)(ctx + 8));
  __dest = this->abbr_ + sVar1 + 1;
  strcpy(__dest,(char *)(ctx + 0x18));
  if ((((*(int *)(ctx + 0x28) == 0) && (*(int *)(ctx + 0x2c) == 0)) && (*(int *)(ctx + 0x30) == 0))
     || (((*(int *)(ctx + 0x40) == 0 && (*(int *)(ctx + 0x44) == 0)) && (*(int *)(ctx + 0x48) == 0))
        )) {
    pvVar6 = (vmtz_ttype *)operator_new__(0x10);
    pvVar7 = pvVar6 + 1;
    pvVar5 = pvVar6;
    do {
      vmtz_ttype::vmtz_ttype(pvVar5);
      pvVar5 = pvVar5 + 1;
    } while (pvVar5 != pvVar7);
    this->ttype_ = pvVar6;
    this->ttype_cnt_ = 1;
    this->ttype_->save = 0;
    if (*(int *)(ctx + 0x58) == 0) {
      this->ttype_->gmtofs = *(int *)ctx * 1000;
      this->ttype_->fmt = pcVar3;
    }
    else {
      this->ttype_->gmtofs = *(int *)(ctx + 4) * 1000;
      this->ttype_->fmt = __dest;
    }
  }
  else {
    this->rule_cnt_ = 2;
    pvVar4 = (vmtz_rule *)operator_new__(0x40);
    this->rule_ = pvVar4;
    vmtz_rule::set(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                   (int32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                   (int32_t)in_stack_ffffffffffffff88);
    vmtz_rule::set(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                   (int32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                   (int32_t)in_stack_ffffffffffffff88);
    pvVar5 = (vmtz_ttype *)operator_new__(0x20);
    pvVar6 = pvVar5 + 2;
    local_50 = pvVar5;
    do {
      vmtz_ttype::vmtz_ttype(local_50);
      local_50 = local_50 + 1;
    } while (local_50 != pvVar6);
    this->ttype_ = pvVar5;
    this->ttype_cnt_ = 2;
    this->ttype_->gmtofs = *(int *)ctx * 1000;
    this->ttype_->save = 0;
    this->ttype_->fmt = pcVar3;
    this->ttype_[1].gmtofs = *(int *)(ctx + 4) * 1000;
    this->ttype_[1].save = (*(int *)(ctx + 4) - *(int *)ctx) * 1000;
    this->ttype_[1].fmt = __dest;
  }
  this->country_[0] = '\0';
  this->coords_[0] = '\0';
  this->desc_ = (char *)0x0;
  return (int)this;
}

Assistant:

void CVmTimeZone::init(const os_tzinfo_t *desc)
{    
    /* we don't have any transitions or rules */
    trans_ = 0;
    trans_cnt_ = 0;
    rule_ = 0;
    rule_cnt_ = 0;

    /* make a copy of our one abbreviation(s) */
    size_t std_abbr_len = strlen(desc->std_abbr);
    size_t dst_abbr_len = strlen(desc->dst_abbr);
    abbr_ = new char[std_abbr_len + dst_abbr_len + 2];

    char *std_abbr = abbr_;
    strcpy(std_abbr, desc->std_abbr);

    char *dst_abbr = abbr_ + std_abbr_len + 1;
    strcpy(dst_abbr, desc->dst_abbr);

    /* if rules for the start/end dates are specified, use them */
    if ((desc->dst_start.jday != 0
         || desc->dst_start.yday != 0
         || desc->dst_start.month != 0)
        && (desc->dst_end.jday != 0
            || desc->dst_end.yday != 0
            || desc->dst_end.month != 0))
    {
        /* we have start/end rules - create our copies */
        rule_cnt_ = 2;
        rule_ = new vmtz_rule[2];

        /* 
         *   Set the rules from the OS description.  Note that the OS
         *   description gives offsets in seconds, whereas we store
         *   everything in milliseconds. 
         */
        rule_[0].set(&desc->dst_start, dst_abbr, desc->std_ofs*1000,
                     (desc->dst_ofs - desc->std_ofs)*1000);
        rule_[1].set(&desc->dst_end, std_abbr, desc->std_ofs*1000, 0);

        /*
         *   allocate space for two types - one for standard time, one for
         *   daylight time
         */
        ttype_ = new vmtz_ttype[2];
        ttype_cnt_ = 2;
        
        /* set up the standard time information */
        ttype_[0].gmtofs = desc->std_ofs * 1000;
        ttype_[0].save = 0;
        ttype_[0].fmt = std_abbr;
        
        /* set up the daylight time information */
        ttype_[1].gmtofs = desc->dst_ofs * 1000;
        ttype_[1].save = (desc->dst_ofs - desc->std_ofs) * 1000;
        ttype_[1].fmt = dst_abbr;
    }
    else
    {
        /*
         *   There are no transition rules, so we only have use for whichever
         *   setting is currently in effect. 
         */
        ttype_ = new vmtz_ttype[1];
        ttype_cnt_ = 1;

        /* use the current setting only */
        ttype_[0].save = 0;
        if (desc->is_dst)
        {
            ttype_[0].gmtofs = desc->dst_ofs * 1000;
            ttype_[0].fmt = dst_abbr;
        }
        else
        {
            ttype_[0].gmtofs = desc->std_ofs * 1000;
            ttype_[0].fmt = std_abbr;
        }
    }

    /* we have no descriptive information */
    country_[0] = '\0';
    coords_[0] = '\0';
    desc_ = 0;
}